

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

Str_Ntk_t * Str_ManNormalizeInt(Gia_Man_t *p,Vec_Wec_t *vGroups,Vec_Int_t *vRoots)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Str_Ntk_t *p_00;
  Str_Obj_t *pSVar5;
  Gia_Obj_t *pObj;
  ulong uVar6;
  int *pFanins;
  int iVar7;
  int iVar8;
  int iFanin;
  Vec_Wec_t *local_40;
  Vec_Int_t *local_38;
  
  local_40 = vGroups;
  local_38 = vRoots;
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0x2dc,"Str_Ntk_t *Str_ManNormalizeInt(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar4 = Vec_IntAlloc(100);
    p->vSuper = pVVar4;
  }
  if (p->vStore == (Vec_Int_t *)0x0) {
    pVVar4 = Vec_IntAlloc(100);
    p->vStore = pVVar4;
  }
  Gia_ManFillValue(p);
  iVar7 = p->vCos->nSize;
  iVar3 = p->nMuxes;
  iVar8 = p->vCis->nSize;
  iVar1 = p->nObjs;
  p_00 = (Str_Ntk_t *)calloc(1,0x50);
  pSVar5 = (Str_Obj_t *)malloc((long)iVar1 << 4);
  p_00->pObjs = pSVar5;
  p_00->nObjsAlloc = iVar1;
  Str_ObjCreate(p_00,1,0,(int *)0x0);
  Vec_IntGrow(&p_00->vFanins,iVar3 + iVar7 + (~(iVar7 + iVar8) + iVar1) * 2 + 1);
  p->pObjs->Value = 0;
  iVar7 = 1;
  do {
    iVar3 = p->nObjs;
    if (iVar3 <= iVar7) {
LAB_00605385:
      if (p_00->nObjs <= iVar3) {
        return p_00;
      }
      __assert_fail("pNtk->nObjs <= Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                    ,0x2ef,"Str_Ntk_t *Str_ManNormalizeInt(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
    }
    pObj = Gia_ManObj(p,iVar7);
    if (pObj == (Gia_Obj_t *)0x0) {
      iVar3 = p->nObjs;
      goto LAB_00605385;
    }
    uVar2 = (uint)*(ulong *)pObj;
    if ((~uVar2 & 0x9fffffff) == 0) {
      iVar8 = 2;
      iVar3 = 0;
      pFanins = (int *)0x0;
LAB_00605371:
      uVar2 = Str_ObjCreate(p_00,iVar8,iVar3,pFanins);
      pObj->Value = uVar2;
    }
    else {
      uVar6 = *(ulong *)pObj & 0x1fffffff;
      if (uVar6 != 0x1fffffff && (int)uVar2 < 0) {
        Str_ManNormalize_rec(p_00,p,pObj + -uVar6,local_40,local_38);
        iFanin = Gia_ObjFanin0Copy(pObj);
        iVar8 = 7;
        iVar3 = 1;
        pFanins = &iFanin;
        goto LAB_00605371;
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Str_Ntk_t * Str_ManNormalizeInt( Gia_Man_t * p, Vec_Wec_t * vGroups, Vec_Int_t * vRoots )
{
    Str_Ntk_t * pNtk;
    Gia_Obj_t * pObj;
    int i, iFanin;
    assert( p->pMuxes != NULL );
    if ( p->vSuper == NULL )
        p->vSuper = Vec_IntAlloc( STR_SUPER );
    if ( p->vStore == NULL )
        p->vStore = Vec_IntAlloc( STR_SUPER );
    Gia_ManFillValue( p );
    pNtk = Str_NtkCreate( Gia_ManObjNum(p), 1 + Gia_ManCoNum(p) + 2 * Gia_ManAndNum(p) + Gia_ManMuxNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Str_ObjCreate( pNtk, STR_PI, 0, NULL );
        else if ( Gia_ObjIsCo(pObj) )
        {
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin0(pObj), vGroups, vRoots );
            iFanin = Gia_ObjFanin0Copy(pObj);
            pObj->Value = Str_ObjCreate( pNtk, STR_PO, 1, &iFanin );
        }
    }
    assert( pNtk->nObjs <= Gia_ManObjNum(p) );
    return pNtk;
}